

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::FileGenerator::GenerateNamespaceOpeners
          (FileGenerator *this,Printer *printer)

{
  pointer pbVar1;
  int i;
  ulong uVar2;
  long lVar3;
  
  if ((this->package_parts_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->package_parts_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::Printer::Print(printer,"\n");
  }
  lVar3 = 0;
  for (uVar2 = 0;
      pbVar1 = (this->package_parts_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->package_parts_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar2 = uVar2 + 1) {
    io::Printer::Print(printer,"namespace $part$ {\n","part",
                       (string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void FileGenerator::GenerateNamespaceOpeners(io::Printer* printer) {
  if (package_parts_.size() > 0) printer->Print("\n");

  for (int i = 0; i < package_parts_.size(); i++) {
    printer->Print("namespace $part$ {\n",
                   "part", package_parts_[i]);
  }
}